

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t size;
  size_t attempt_count;
  size_t spread;
  char *pcVar1;
  typed_value<unsigned_long,_char> *ptVar2;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar3;
  const_iterator cVar4;
  long *plVar5;
  any *paVar6;
  unsigned_long *puVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *type;
  string *type_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  types;
  variables_map vm;
  options_description description;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [32];
  string *local_190;
  pointer local_180 [2];
  undefined1 local_170 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  unsigned_long local_e0;
  long *local_d8 [2];
  long local_c8 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_b0 [24];
  void *local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  long local_78;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_70 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  
  local_180[0] = (pointer)local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,anon_var_dwarf_13d59,anon_var_dwarf_13d59 + 10);
  boost::program_options::options_description::options_description
            ((options_description *)local_d8,(string *)local_180,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if (local_180[0] != (pointer)local_170) {
    operator_delete(local_180[0],(ulong)((long)&((_Alloc_hider *)local_170._0_8_)->_M_p + 1));
  }
  local_180[0] = (pointer)boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_180,"help,h");
  ptVar2 = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  local_1c0._0_8_ = (pointer)0x3e8;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,(unsigned_long *)local_1c0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)0x10e391,(char *)ptVar2);
  ptVar2 = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  local_1b0._24_8_ = (string *)0x3e8;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,(unsigned_long *)(local_1b0 + 0x18));
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"attempts",(char *)ptVar2);
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0);
  ptVar3->m_multitoken = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"type",(char *)ptVar3);
  ptVar2 = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  local_e0 = 1;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value(ptVar2,&local_e0)
  ;
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"spread",(char *)ptVar2);
  boost::program_options::variables_map::variables_map((variables_map *)local_180);
  local_58.super_function_base.vtable = (vtable_base *)0x0;
  local_58.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_58.super_function_base.functor._8_8_ = 0;
  local_58.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_1c0,argc,argv,(options_description *)local_d8,0,
             &local_58);
  boost::program_options::store((basic_parsed_options *)local_1c0,(variables_map *)local_180,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1c0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_58);
  boost::program_options::notify((variables_map *)local_180);
  local_1c0._0_8_ = (pointer)local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"help","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)local_170,(key_type *)local_1c0);
  if ((pointer)local_1c0._0_8_ != (pointer)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._0_8_ + 1));
  }
  if (cVar4._M_node == (_Base_ptr)(local_170 + 8)) {
    local_1c0._0_8_ = (pointer)local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"size","");
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_180);
    puVar7 = boost::any_cast<unsigned_long_const&>(paVar6);
    size = *puVar7;
    if ((pointer)local_1c0._0_8_ != (pointer)local_1b0) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._0_8_ + 1));
    }
    local_1c0._0_8_ = (pointer)local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"attempts","");
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_180);
    puVar7 = boost::any_cast<unsigned_long_const&>(paVar6);
    attempt_count = *puVar7;
    if ((pointer)local_1c0._0_8_ != (pointer)local_1b0) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._0_8_ + 1));
    }
    local_1c0._0_8_ = (pointer)local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"type","");
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_180);
    __x = boost::
          any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                    (paVar6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_1b0 + 0x18),__x);
    if ((pointer)local_1c0._0_8_ != (pointer)local_1b0) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._0_8_ + 1));
    }
    local_1c0._0_8_ = (pointer)local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"spread","");
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_180);
    puVar7 = boost::any_cast<unsigned_long_const&>(paVar6);
    spread = *puVar7;
    if ((pointer)local_1c0._0_8_ != (pointer)local_1b0) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._0_8_ + 1));
    }
    test_dyntuple_access(size,attempt_count);
    test_vector_access(size,attempt_count);
    for (type_00 = (string *)local_1b0._24_8_; type_00 != local_190; type_00 = type_00 + 1) {
      test_pointer_array_access(size,attempt_count,type_00,spread);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + 0x18));
  }
  else {
    plVar5 = (long *)boost::program_options::operator<<
                               ((ostream *)&std::cout,(options_description *)local_d8);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
  }
  local_180[0] = (pointer)__cxa_throw;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_110);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_140);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)local_170);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_70);
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,local_78 - (long)local_98);
    local_98 = (void *)0x0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    local_78 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_b0);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  return 0;
}

Assistant:

int main (int argc, const char * argv[])
{
    namespace bpo = boost::program_options;

    bpo::options_description description("Опции");
    description.add_options()
        ("help,h", "Подсказка.")
        ("size", bpo::value<std::size_t>()->default_value(1000),
            "Размер испытываемых массивов.")
        ("attempts", bpo::value<std::size_t>()->default_value(1000),
            "Количество испытаний.")
        ("type", bpo::value<std::vector<std::string>>()->multitoken(),
            "Типы массива указателей.\nДопустимые значения: plain, sparse, shuffled.")
        ("spread", bpo::value<std::size_t>()->default_value(1),
            "Степень разреженности массива указателей.\n"
            "Создаёт массив указателей размера `size * spread`, который затем, в зависимости от "
            "выбранного типа массива, либо прореживается, либо перемешивается.\n"
            "В случае с простым (plain) массивом опция игнорируется.");

    try
    {
        bpo::variables_map vm;
        bpo::store(bpo::parse_command_line(argc, argv, description), vm);
        bpo::notify(vm);

        if (vm.count("help"))
        {
            std::cout << description << std::endl;
        }
        else
        {
            auto size = vm["size"].as<std::size_t>();
            auto attempts = vm["attempts"].as<std::size_t>();
            auto types = vm["type"].as<std::vector<std::string>>();
            auto spread = vm["spread"].as<std::size_t>();

            test_dyntuple_access(size, attempts);
            test_vector_access(size, attempts);
            for (const auto & type: types)
            {
                test_pointer_array_access(size, attempts, type, spread);
            }
        }
    }
    catch (bpo::error & e)
    {
        std::cout << e.what() << std::endl;
        std::cout << description << std::endl;
    }
}